

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O3

OptionBase<std::vector<bool,_std::allocator<bool>_>_> * __thiscall
Lib::OptionBase<std::vector<bool,_std::allocator<bool>_>_>::operator=
          (OptionBase<std::vector<bool,_std::allocator<bool>_>_> *this,
          OptionBase<std::vector<bool,_std::allocator<bool>_>_> *other)

{
  _Bit_pointer puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  _Bit_type *p_Var4;
  undefined8 uVar5;
  bool bVar6;
  
  if (this->_isSome == true) {
    std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
              ((_Bvector_base<std::allocator<bool>_> *)&this->_elem);
  }
  bVar6 = other->_isSome;
  if (bVar6 == true) {
    uVar2 = (other->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar3 = *(undefined8 *)
             ((long)&(other->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8);
    p_Var4 = (other->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    uVar5 = *(undefined8 *)
             ((long)&(other->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8);
    puVar1 = (other->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_end_of_storage;
    (other->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (other->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (other->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    *(undefined4 *)((long)&(other->_elem)._elem + 8) = 0;
    *(undefined4 *)((long)&(other->_elem)._elem + 0x18) = 0;
    (this->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)uVar2;
    *(undefined8 *)
     ((long)&(this->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8) = uVar3;
    (this->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var4;
    *(undefined8 *)
     ((long)&(this->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = uVar5;
    (this->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = puVar1;
    bVar6 = other->_isSome;
  }
  this->_isSome = bVar6;
  return this;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }